

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O3

MemoryAccessMask __thiscall
anon_unknown.dwarf_12a4996::TGlslangToSpvTraverser::TranslateMemoryAccess
          (TGlslangToSpvTraverser *this,CoherentFlags *coherentFlags)

{
  MemoryAccessMask MVar1;
  MemoryAccessMask MVar2;
  Capability local_c;
  
  MVar2 = (MemoryAccessMask)coherentFlags;
  MVar1 = MaskNone;
  if (((MVar2 >> 9 & 1) == 0 & this->glslangIntermediate->useVulkanMemoryModel) == 1) {
    MVar1 = MakePointerVisible|MakePointerAvailable;
    if (((ulong)coherentFlags & 0xbf) == 0) {
      MVar1 = MVar2 & 0xbf;
    }
    MVar1 = (MemoryAccessMask)((ulong)coherentFlags >> 7) & MemoryAccessVolatileMask |
            (MemoryAccessMask)((ulong)coherentFlags >> 1) & MemoryAccessNonPrivatePointerKHRMask |
            MVar1;
    if ((MVar2 >> 8 & 1) == 0) {
      if (MVar1 == MaskNone) {
        return MaskNone;
      }
    }
    else {
      MVar1 = MVar1 | MemoryAccessNontemporalMask;
    }
    local_c = CapabilityVulkanMemoryModel;
    std::
    _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
    ::_M_insert_unique<spv::Capability_const&>
              ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                *)&(this->builder).capabilities,&local_c);
  }
  return MVar1;
}

Assistant:

spv::MemoryAccessMask TGlslangToSpvTraverser::TranslateMemoryAccess(
    const spv::Builder::AccessChain::CoherentFlags &coherentFlags)
{
    spv::MemoryAccessMask mask = spv::MemoryAccessMaskNone;

    if (!glslangIntermediate->usingVulkanMemoryModel() || coherentFlags.isImage)
        return mask;

    if (coherentFlags.isVolatile() || coherentFlags.anyCoherent()) {
        mask = mask | spv::MemoryAccessMakePointerAvailableKHRMask |
                      spv::MemoryAccessMakePointerVisibleKHRMask;
    }

    if (coherentFlags.nonprivate) {
        mask = mask | spv::MemoryAccessNonPrivatePointerKHRMask;
    }
    if (coherentFlags.volatil) {
        mask = mask | spv::MemoryAccessVolatileMask;
    }
    if (coherentFlags.nontemporal) {
        mask = mask | spv::MemoryAccessNontemporalMask;
    }
    if (mask != spv::MemoryAccessMaskNone) {
        builder.addCapability(spv::CapabilityVulkanMemoryModelKHR);
    }

    return mask;
}